

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInAlsa::openPort(MidiInAlsa *this,uint portNumber,string *portName)

{
  undefined8 *puVar1;
  snd_seq_t *seq;
  undefined8 uVar2;
  string *psVar3;
  snd_seq_port_info_t *psVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  ostream *poVar10;
  snd_seq_port_info_t *psVar11;
  undefined8 uVar12;
  MidiApi *pMVar13;
  string *psVar14;
  undefined8 uStack_3c0;
  snd_seq_port_info_t asStack_3b8 [8];
  string *local_3b0;
  string *local_3a8;
  string *local_3a0;
  string *local_398;
  string *local_390;
  string *local_388;
  string *local_380;
  string *local_378;
  snd_seq_port_info_t *local_370;
  snd_seq_port_info_t *local_368;
  string *local_360;
  string *local_358;
  ostream *local_350;
  ostream *local_348;
  ostream *local_340;
  snd_seq_port_info_t *local_338;
  string *local_330;
  string *local_328;
  string *local_320;
  string *local_318;
  MidiApi *local_310;
  string local_308;
  int local_2e4;
  undefined1 local_2e0 [4];
  int err;
  pthread_attr_t attr;
  string local_288;
  string local_268;
  snd_seq_port_info_t *local_248;
  snd_seq_port_info_t *pinfo;
  undefined1 local_238 [4];
  snd_seq_addr_t receiver;
  snd_seq_addr_t sender;
  string local_218 [32];
  ostringstream local_1f8 [8];
  ostringstream ost;
  AlsaMidiData *data;
  snd_seq_port_info_t *src_pinfo;
  int local_50;
  uint nSrc;
  string local_40;
  string *local_20;
  string *portName_local;
  MidiInAlsa *pMStack_10;
  uint portNumber_local;
  MidiInAlsa *this_local;
  
  local_310 = (MidiApi *)this;
  local_20 = portName;
  portName_local._4_4_ = portNumber;
  pMStack_10 = this;
  if (((this->super_MidiInApi).super_MidiApi.connected_ & 1U) == 0) {
    uStack_3c0 = 0x117428;
    local_50 = (*(this->super_MidiInApi).super_MidiApi._vptr_MidiApi[8])();
    if (local_50 == 0) {
      local_330 = (string *)&local_310->errorString_;
      uStack_3c0 = 0x11744f;
      std::__cxx11::string::operator=
                (local_330,"MidiInAlsa::openPort: no MIDI input sources found!");
      local_328 = (string *)&src_pinfo;
      uStack_3c0 = 0x117466;
      std::__cxx11::string::string((string *)local_328,local_330);
      uStack_3c0 = 0x11747e;
      MidiApi::error(local_310,NO_DEVICES_FOUND,local_328);
      uStack_3c0 = 0x117489;
      std::__cxx11::string::~string((string *)&src_pinfo);
    }
    else {
      uStack_3c0 = 0x1174af;
      lVar8 = snd_seq_port_info_sizeof();
      lVar8 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
      psVar11 = asStack_3b8 + lVar8;
      local_338 = psVar11;
      *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x1174d7;
      sVar9 = snd_seq_port_info_sizeof();
      psVar4 = local_338;
      *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x1174e8;
      memset(psVar4,0,sVar9);
      uVar5 = portName_local._4_4_;
      puVar1 = (undefined8 *)local_310->apiData_;
      seq = (snd_seq_t *)*puVar1;
      *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x11750f;
      uVar5 = portInfo(seq,psVar11,0x21,uVar5);
      if (uVar5 == 0) {
        local_348 = (ostream *)local_1f8;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x11752b;
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        poVar10 = local_348;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x11753e;
        poVar10 = std::operator<<(poVar10,"MidiInAlsa::openPort: the \'portNumber\' argument (");
        uVar5 = portName_local._4_4_;
        local_340 = poVar10;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117556;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar5);
        local_350 = poVar10;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117572;
        std::operator<<(poVar10,") is invalid.");
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117587;
        std::__cxx11::ostringstream::str();
        psVar14 = &local_310->errorString_;
        local_360 = local_218;
        local_358 = (string *)psVar14;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x1175ae;
        std::__cxx11::string::operator=((string *)psVar14,local_218);
        psVar3 = local_360;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x1175ba;
        std::__cxx11::string::~string(psVar3);
        psVar3 = local_358;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x1175cd;
        std::__cxx11::string::string((string *)local_238,psVar3);
        pMVar13 = local_310;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x1175e7;
        MidiApi::error(pMVar13,INVALID_PARAMETER,(string *)local_238);
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x1175f5;
        std::__cxx11::string::~string((string *)local_238);
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117601;
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
      }
      else {
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117646;
        pinfo._6_1_ = snd_seq_port_info_get_client(psVar11);
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117655;
        pinfo._7_1_ = snd_seq_port_info_get_port(psVar11);
        uVar12 = *puVar1;
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117667;
        pinfo._4_1_ = snd_seq_client_id(uVar12);
        *(undefined8 *)(asStack_3b8 + lVar8 + -8) = 0x117672;
        lVar8 = snd_seq_port_info_sizeof();
        psVar11 = psVar11 + -(lVar8 + 0xfU & 0xfffffffffffffff0);
        local_368 = psVar11;
        local_248 = psVar11;
        *(undefined8 *)(psVar11 + -8) = 0x1176a0;
        sVar9 = snd_seq_port_info_sizeof();
        psVar4 = local_368;
        *(undefined8 *)(psVar11 + -8) = 0x1176b1;
        memset(psVar4,0,sVar9);
        psVar4 = local_248;
        if (*(int *)((long)puVar1 + 0xc) < 0) {
          *(undefined8 *)(psVar11 + -8) = 0x1176cd;
          snd_seq_port_info_set_client(psVar4,0);
          psVar4 = local_248;
          *(undefined8 *)(psVar11 + -8) = 0x1176db;
          snd_seq_port_info_set_port(psVar4,0);
          psVar4 = local_248;
          *(undefined8 *)(psVar11 + -8) = 0x1176ec;
          snd_seq_port_info_set_capability(psVar4,0x42);
          psVar4 = local_248;
          *(undefined8 *)(psVar11 + -8) = 0x1176fd;
          snd_seq_port_info_set_type(psVar4,0x100002);
          psVar4 = local_248;
          *(undefined8 *)(psVar11 + -8) = 0x11770e;
          snd_seq_port_info_set_midi_channels(psVar4,0x10);
          psVar4 = local_248;
          *(undefined8 *)(psVar11 + -8) = 0x11771f;
          snd_seq_port_info_set_timestamping(psVar4,1);
          psVar4 = local_248;
          *(undefined8 *)(psVar11 + -8) = 0x117730;
          snd_seq_port_info_set_timestamp_real(psVar4,1);
          psVar4 = local_248;
          uVar6 = *(undefined4 *)(puVar1 + 9);
          *(undefined8 *)(psVar11 + -8) = 0x117743;
          snd_seq_port_info_set_timestamp_queue(psVar4,uVar6);
          local_370 = local_248;
          *(undefined8 *)(psVar11 + -8) = 0x11775a;
          uVar12 = std::__cxx11::string::c_str();
          psVar4 = local_370;
          *(undefined8 *)(psVar11 + -8) = 0x117769;
          snd_seq_port_info_set_name(psVar4,uVar12);
          psVar4 = local_248;
          uVar12 = *puVar1;
          *(undefined8 *)(psVar11 + -8) = 0x11777c;
          uVar6 = snd_seq_create_port(uVar12,psVar4);
          psVar4 = local_248;
          *(undefined4 *)((long)puVar1 + 0xc) = uVar6;
          if (*(int *)((long)puVar1 + 0xc) < 0) {
            psVar14 = &local_310->errorString_;
            local_380 = (string *)psVar14;
            *(undefined8 *)(psVar11 + -8) = 0x1177b1;
            std::__cxx11::string::operator=
                      ((string *)psVar14,"MidiInAlsa::openPort: ALSA error creating input port.");
            psVar3 = local_380;
            local_378 = &local_268;
            *(undefined8 *)(psVar11 + -8) = 0x1177cb;
            std::__cxx11::string::string((string *)&local_268,psVar3);
            pMVar13 = local_310;
            psVar14 = local_378;
            *(undefined8 *)(psVar11 + -8) = 0x1177e3;
            MidiApi::error(pMVar13,DRIVER_ERROR,psVar14);
            *(undefined8 *)(psVar11 + -8) = 0x1177f1;
            std::__cxx11::string::~string((string *)&local_268);
            return;
          }
          *(undefined8 *)(psVar11 + -8) = 0x11781f;
          uVar6 = snd_seq_port_info_get_port(psVar4);
          *(undefined4 *)((long)puVar1 + 0xc) = uVar6;
        }
        pinfo._5_1_ = (undefined1)*(undefined4 *)((long)puVar1 + 0xc);
        if (puVar1[2] == 0) {
          *(undefined8 *)(psVar11 + -8) = 0x117851;
          iVar7 = snd_seq_port_subscribe_malloc(puVar1 + 2);
          if (iVar7 < 0) {
            psVar14 = &local_310->errorString_;
            local_390 = (string *)psVar14;
            *(undefined8 *)(psVar11 + -8) = 0x117878;
            std::__cxx11::string::operator=
                      ((string *)psVar14,
                       "MidiInAlsa::openPort: ALSA error allocation port subscription.");
            psVar3 = local_390;
            local_388 = &local_288;
            *(undefined8 *)(psVar11 + -8) = 0x117892;
            std::__cxx11::string::string((string *)&local_288,psVar3);
            pMVar13 = local_310;
            psVar14 = local_388;
            *(undefined8 *)(psVar11 + -8) = 0x1178aa;
            MidiApi::error(pMVar13,DRIVER_ERROR,psVar14);
            *(undefined8 *)(psVar11 + -8) = 0x1178b8;
            std::__cxx11::string::~string((string *)&local_288);
            return;
          }
          uVar12 = puVar1[2];
          *(undefined8 *)(psVar11 + -8) = 0x1178ee;
          snd_seq_port_subscribe_set_sender(uVar12,(long)&pinfo + 6);
          uVar12 = puVar1[2];
          *(undefined8 *)(psVar11 + -8) = 0x117902;
          snd_seq_port_subscribe_set_dest(uVar12,(long)&pinfo + 4);
          uVar12 = *puVar1;
          uVar2 = puVar1[2];
          *(undefined8 *)(psVar11 + -8) = 0x117916;
          iVar7 = snd_seq_subscribe_port(uVar12,uVar2);
          if (iVar7 != 0) {
            uVar12 = puVar1[2];
            *(undefined8 *)(psVar11 + -8) = 0x11792c;
            snd_seq_port_subscribe_free(uVar12);
            puVar1[2] = 0;
            psVar14 = &local_310->errorString_;
            local_3a0 = (string *)psVar14;
            *(undefined8 *)(psVar11 + -8) = 0x117956;
            std::__cxx11::string::operator=
                      ((string *)psVar14,"MidiInAlsa::openPort: ALSA error making port connection.")
            ;
            psVar3 = local_3a0;
            local_398 = (string *)(attr.__size + 0x30);
            *(undefined8 *)(psVar11 + -8) = 0x117970;
            std::__cxx11::string::string((string *)(attr.__size + 0x30),psVar3);
            pMVar13 = local_310;
            psVar14 = local_398;
            *(undefined8 *)(psVar11 + -8) = 0x117988;
            MidiApi::error(pMVar13,DRIVER_ERROR,psVar14);
            *(undefined8 *)(psVar11 + -8) = 0x117996;
            std::__cxx11::string::~string((string *)(attr.__size + 0x30));
            return;
          }
        }
        if (((ulong)local_310[1].errorCallback_ & 0x100) == 0) {
          uVar12 = *puVar1;
          uVar6 = *(undefined4 *)(puVar1 + 9);
          *(undefined8 *)(psVar11 + -8) = 0x1179f4;
          snd_seq_control_queue(uVar12,uVar6,0x1e,0,0);
          uVar12 = *puVar1;
          *(undefined8 *)(psVar11 + -8) = 0x117a00;
          snd_seq_drain_output(uVar12);
          *(undefined8 *)(psVar11 + -8) = 0x117a0c;
          pthread_attr_init((pthread_attr_t *)local_2e0);
          *(undefined8 *)(psVar11 + -8) = 0x117a1a;
          pthread_attr_setdetachstate((pthread_attr_t *)local_2e0,0);
          *(undefined8 *)(psVar11 + -8) = 0x117a28;
          pthread_attr_setschedpolicy((pthread_attr_t *)local_2e0,0);
          *(bool *)((long)&local_310[1].errorCallback_ + 1) = true;
          pMVar13 = local_310 + 1;
          *(undefined8 *)(psVar11 + -8) = 0x117a55;
          local_2e4 = pthread_create(puVar1 + 6,(pthread_attr_t *)local_2e0,alsaMidiHandler,pMVar13)
          ;
          *(undefined8 *)(psVar11 + -8) = 0x117a67;
          pthread_attr_destroy((pthread_attr_t *)local_2e0);
          if (local_2e4 != 0) {
            uVar12 = *puVar1;
            uVar2 = puVar1[2];
            *(undefined8 *)(psVar11 + -8) = 0x117a84;
            snd_seq_unsubscribe_port(uVar12,uVar2);
            uVar12 = puVar1[2];
            *(undefined8 *)(psVar11 + -8) = 0x117a91;
            snd_seq_port_subscribe_free(uVar12);
            puVar1[2] = 0;
            *(bool *)((long)&local_310[1].errorCallback_ + 1) = false;
            psVar14 = &local_310->errorString_;
            local_3b0 = (string *)psVar14;
            *(undefined8 *)(psVar11 + -8) = 0x117ac2;
            std::__cxx11::string::operator=
                      ((string *)psVar14,"MidiInAlsa::openPort: error starting MIDI input thread!");
            psVar3 = local_3b0;
            local_3a8 = &local_308;
            *(undefined8 *)(psVar11 + -8) = 0x117adc;
            std::__cxx11::string::string((string *)&local_308,psVar3);
            pMVar13 = local_310;
            psVar14 = local_3a8;
            *(undefined8 *)(psVar11 + -8) = 0x117af4;
            MidiApi::error(pMVar13,THREAD_ERROR,psVar14);
            *(undefined8 *)(psVar11 + -8) = 0x117b02;
            std::__cxx11::string::~string((string *)&local_308);
            return;
          }
        }
        local_310->connected_ = true;
      }
    }
  }
  else {
    local_320 = (string *)&(this->super_MidiInApi).super_MidiApi.errorString_;
    uStack_3c0 = 0x1173c5;
    std::__cxx11::string::operator=
              (local_320,"MidiInAlsa::openPort: a valid connection already exists!");
    local_318 = &local_40;
    uStack_3c0 = 0x1173dc;
    std::__cxx11::string::string((string *)local_318,local_320);
    uStack_3c0 = 0x1173f1;
    MidiApi::error(local_310,WARNING,local_318);
    uStack_3c0 = 0x1173fc;
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void MidiInAlsa :: openPort( unsigned int portNumber, const std::string &portName )
{
  if ( connected_ ) {
    errorString_ = "MidiInAlsa::openPort: a valid connection already exists!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  unsigned int nSrc = this->getPortCount();
  if ( nSrc < 1 ) {
    errorString_ = "MidiInAlsa::openPort: no MIDI input sources found!";
    error( RtMidiError::NO_DEVICES_FOUND, errorString_ );
    return;
  }

  snd_seq_port_info_t *src_pinfo;
  snd_seq_port_info_alloca( &src_pinfo );
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, src_pinfo, SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ, (int) portNumber ) == 0 ) {
    std::ostringstream ost;
    ost << "MidiInAlsa::openPort: the 'portNumber' argument (" << portNumber << ") is invalid.";
    errorString_ = ost.str();
    error( RtMidiError::INVALID_PARAMETER, errorString_ );
    return;
  }

  snd_seq_addr_t sender, receiver;
  sender.client = snd_seq_port_info_get_client( src_pinfo );
  sender.port = snd_seq_port_info_get_port( src_pinfo );
  receiver.client = snd_seq_client_id( data->seq );

  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  if ( data->vport < 0 ) {
    snd_seq_port_info_set_client( pinfo, 0 );
    snd_seq_port_info_set_port( pinfo, 0 );
    snd_seq_port_info_set_capability( pinfo,
                                      SND_SEQ_PORT_CAP_WRITE |
                                      SND_SEQ_PORT_CAP_SUBS_WRITE );
    snd_seq_port_info_set_type( pinfo,
                                SND_SEQ_PORT_TYPE_MIDI_GENERIC |
                                SND_SEQ_PORT_TYPE_APPLICATION );
    snd_seq_port_info_set_midi_channels(pinfo, 16);
#ifndef AVOID_TIMESTAMPING
    snd_seq_port_info_set_timestamping( pinfo, 1 );
    snd_seq_port_info_set_timestamp_real( pinfo, 1 );
    snd_seq_port_info_set_timestamp_queue( pinfo, data->queue_id );
#endif
    snd_seq_port_info_set_name( pinfo,  portName.c_str() );
    data->vport = snd_seq_create_port( data->seq, pinfo );

    if ( data->vport < 0 ) {
      errorString_ = "MidiInAlsa::openPort: ALSA error creating input port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    data->vport = snd_seq_port_info_get_port( pinfo );
  }

  receiver.port = data->vport;

  if ( !data->subscription ) {
    // Make subscription
    if ( snd_seq_port_subscribe_malloc( &data->subscription ) < 0 ) {
      errorString_ = "MidiInAlsa::openPort: ALSA error allocation port subscription.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    snd_seq_port_subscribe_set_sender( data->subscription, &sender );
    snd_seq_port_subscribe_set_dest( data->subscription, &receiver );
    if ( snd_seq_subscribe_port( data->seq, data->subscription ) ) {
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
      errorString_ = "MidiInAlsa::openPort: ALSA error making port connection.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
  }

  if ( inputData_.doInput == false ) {
    // Start the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_start_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    // Start our MIDI input thread.
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );

    inputData_.doInput = true;
    int err = pthread_create( &data->thread, &attr, alsaMidiHandler, &inputData_ );
    pthread_attr_destroy( &attr );
    if ( err ) {
      snd_seq_unsubscribe_port( data->seq, data->subscription );
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
      inputData_.doInput = false;
      errorString_ = "MidiInAlsa::openPort: error starting MIDI input thread!";
      error( RtMidiError::THREAD_ERROR, errorString_ );
      return;
    }
  }

  connected_ = true;
}